

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Header::Minefield_Header(Minefield_Header *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  Minefield_Header *this_local;
  
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Minefield_Header_0032bf58;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_MinefieldID);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Minefield_Header::Minefield_Header(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}